

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

bool __thiscall
libtorrent::aux::torrent::add_hashes
          (torrent *this,hash_request *req,span<libtorrent::digest32<256L>_> hashes)

{
  piece_index_t pVar1;
  hash_picker *this_00;
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> _Var2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  pointer psVar6;
  pointer ppVar7;
  add_hashes_result result;
  byte local_81;
  vector<int,_std::allocator<int>_> local_80;
  add_hashes_result local_68;
  
  need_hash_picker(this);
  this_00 = (this->super_torrent_hot_members).m_hash_picker._M_t.
            super___uniq_ptr_impl<libtorrent::aux::hash_picker,_std::default_delete<libtorrent::aux::hash_picker>_>
            ._M_t.
            super__Tuple_impl<0UL,_libtorrent::aux::hash_picker_*,_std::default_delete<libtorrent::aux::hash_picker>_>
            .super__Head_base<0UL,_libtorrent::aux::hash_picker_*,_false>._M_head_impl;
  if (this_00 == (hash_picker *)0x0) {
    local_81 = 1;
  }
  else {
    hash_picker::add_hashes(&local_68,this_00,req,(span<const_libtorrent::digest32<256L>_>)hashes);
    for (ppVar7 = local_68.hash_failed.
                  super__Vector_base<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar7 != local_68.hash_failed.
                  super__Vector_base<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; ppVar7 = ppVar7 + 1) {
      bVar3 = digest32<160L>::is_all_zeros
                        (&(((this->super_torrent_hot_members).m_torrent_file.
                            super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->m_info_hash).v1);
      if ((bVar3) || (bVar3 = have_piece(this,(piece_index_t)(ppVar7->first).m_val), !bVar3)) {
        _Var2._M_head_impl =
             (this->super_torrent_hot_members).m_picker._M_t.
             super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
             ._M_t.
             super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
             .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl;
        iVar5 = 3;
        if ((_Var2._M_head_impl != (piece_picker *)0x0) &&
           (pVar1.m_val = (ppVar7->first).m_val,
           (*(uint *)(*(long *)&(_Var2._M_head_impl)->m_piece_map + (long)pVar1.m_val * 8) &
           0x1c000000) != 0x10000000)) {
          ::std::vector<int,_std::allocator<int>_>::vector(&local_80,&ppVar7->second);
          piece_failed(this,pVar1,&local_80);
          iVar5 = 0;
          if (local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (pointer)0x0) {
            operator_delete(local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
        }
      }
      else {
        handle_inconsistent_hashes(this,(piece_index_t)(ppVar7->first).m_val);
        local_81 = local_68.valid;
        iVar5 = 1;
      }
      if ((iVar5 != 3) && (iVar5 != 0)) break;
    }
    psVar6 = local_68.hash_passed.
             super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (ppVar7 == local_68.hash_failed.
                  super__Vector_base<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      for (; psVar6 != local_68.hash_passed.
                       super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish; psVar6 = psVar6 + 1) {
        pVar1.m_val = psVar6->m_val;
        bVar3 = digest32<160L>::is_all_zeros
                          (&(((this->super_torrent_hot_members).m_torrent_file.
                              super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->m_info_hash).v1);
        if ((bVar3) || (bVar3 = have_piece(this,pVar1), bVar3)) {
          _Var2._M_head_impl =
               (this->super_torrent_hot_members).m_picker._M_t.
               super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
               ._M_t.
               super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
               .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl;
          bVar3 = true;
          if ((_Var2._M_head_impl != (piece_picker *)0x0) &&
             ((((*(uint *)(*(long *)&(_Var2._M_head_impl)->m_piece_map + (long)pVar1.m_val * 8) &
                0x1c000000) != 0x10000000 &&
               (bVar4 = piece_picker::is_piece_finished(_Var2._M_head_impl,pVar1), bVar4)) &&
              (bVar4 = piece_picker::is_hashing
                                 ((this->super_torrent_hot_members).m_picker._M_t.
                                  super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                                  .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                                  _M_head_impl,pVar1), !bVar4)))) {
            piece_passed(this,pVar1);
          }
        }
        else {
          handle_inconsistent_hashes(this,pVar1);
          local_81 = local_68.valid;
          bVar3 = false;
        }
        if (!bVar3) break;
      }
      if (psVar6 == local_68.hash_passed.
                    super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        local_81 = local_68.valid;
      }
    }
    if (local_68.hash_passed.
        super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.hash_passed.
                      super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.hash_passed.
                            super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.hash_passed.
                            super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    ::std::
    vector<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::~vector(&local_68.hash_failed);
  }
  return (bool)(local_81 & 1);
}

Assistant:

bool torrent::add_hashes(hash_request const& req, span<sha256_hash> hashes)
	{
		need_hash_picker();
		if (!m_hash_picker) return true;
		add_hashes_result const result = m_hash_picker->add_hashes(req, hashes);
		for (auto& p : result.hash_failed)
		{
			if (torrent_file().info_hashes().has_v1() && have_piece(p.first))
			{
				handle_inconsistent_hashes(p.first);
				return result.valid;
			}

			TORRENT_ASSERT(!have_piece(p.first));

			// the piece may not have been downloaded in this session
			// it should be open for downloading so nothing needs to be done here
			if (!m_picker || !m_picker->is_downloading(p.first)) continue;
			piece_failed(p.first, p.second);
		}
		for (piece_index_t p : result.hash_passed)
		{
			if (torrent_file().info_hashes().has_v1() && !have_piece(p))
			{
				handle_inconsistent_hashes(p);
				return result.valid;
			}

			if (m_picker && m_picker->is_downloading(p) && m_picker->is_piece_finished(p)
				&& !m_picker->is_hashing(p))
			{
				piece_passed(p);
			}
		}
		return result.valid;
	}